

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server_test.cpp
# Opt level: O2

string * GetFile_abi_cxx11_(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string *in_RDI;
  string str;
  ifstream t;
  undefined8 auStack_130 [36];
  
  std::ifstream::ifstream(&t,"logo.png",_S_in);
  paVar1 = &str.field_2;
  str._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<std::istreambuf_iterator<char,std::char_traits<char>>>
            ((string *)&str,*(undefined8 *)((long)auStack_130 + *(long *)(_t + -0x18)),
             0xffffffffffffffff,0,0xffffffff);
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)str._M_dataplus._M_p == paVar1) {
    (in_RDI->field_2)._M_allocated_capacity =
         CONCAT71(str.field_2._M_allocated_capacity._1_7_,str.field_2._M_local_buf[0]);
    *(undefined8 *)((long)&in_RDI->field_2 + 8) = str.field_2._8_8_;
  }
  else {
    (in_RDI->_M_dataplus)._M_p = str._M_dataplus._M_p;
    (in_RDI->field_2)._M_allocated_capacity =
         CONCAT71(str.field_2._M_allocated_capacity._1_7_,str.field_2._M_local_buf[0]);
  }
  in_RDI->_M_string_length = str._M_string_length;
  str._M_string_length = 0;
  str.field_2._M_local_buf[0] = '\0';
  str._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::~string((string *)&str);
  std::ifstream::~ifstream(&t);
  return in_RDI;
}

Assistant:

std::string GetFile() {
    std::ifstream t("logo.png");
    std::string str((std::istreambuf_iterator<char>(t)),
        std::istreambuf_iterator<char>());
    return std::move(str);
}